

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodePrintAllStats(void *arkode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  SUNOutputFormat in_EDX;
  FILE *in_RSI;
  ARKodeMem in_RDI;
  ARKodeRootMem ark_root_mem;
  ARKodeMem ark_mem;
  int retval;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xa9d,"ARKodePrintAllStats",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (in_EDX == SUN_OUTPUTFORMAT_TABLE) {
      fprintf(in_RSI,"Current time                 = %.16g\n",in_RDI->tcur);
      fprintf(in_RSI,"Steps                        = %ld\n",in_RDI->nst);
      fprintf(in_RSI,"Step attempts                = %ld\n",in_RDI->nst_attempts);
      fprintf(in_RSI,"Stability limited steps      = %ld\n",in_RDI->hadapt_mem->nst_exp);
      fprintf(in_RSI,"Accuracy limited steps       = %ld\n",in_RDI->hadapt_mem->nst_acc);
      fprintf(in_RSI,"Error test fails             = %ld\n",in_RDI->netf);
      fprintf(in_RSI,"NLS step fails               = %ld\n",in_RDI->ncfn);
      fprintf(in_RSI,"Inequality constraint fails  = %ld\n",in_RDI->nconstrfails);
      fprintf(in_RSI,"Initial step size            = %.16g\n",in_RDI->h0u);
      fprintf(in_RSI,"Last step size               = %.16g\n",in_RDI->hold);
      fprintf(in_RSI,"Current step size            = %.16g\n",in_RDI->next_h);
      if (in_RDI->root_mem != (ARKodeRootMem)0x0) {
        fprintf(in_RSI,"Root fn evals                = %ld\n",in_RDI->root_mem->nge);
      }
    }
    else {
      if (in_EDX != SUN_OUTPUTFORMAT_CSV) {
        arkProcessError(in_RDI,-0x16,0xad0,"ARKodePrintAllStats",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                        ,"Invalid formatting option.");
        return -0x16;
      }
      fprintf(in_RSI,"Time,%.16g",in_RDI->tcur);
      fprintf(in_RSI,",Steps,%ld",in_RDI->nst);
      fprintf(in_RSI,",Step attempts,%ld",in_RDI->nst_attempts);
      fprintf(in_RSI,",Stability limited steps,%ld",in_RDI->hadapt_mem->nst_exp);
      fprintf(in_RSI,",Accuracy limited steps,%ld",in_RDI->hadapt_mem->nst_acc);
      fprintf(in_RSI,",Error test fails,%ld",in_RDI->netf);
      fprintf(in_RSI,",NLS step fails,%ld",in_RDI->ncfn);
      fprintf(in_RSI,",Inequality constraint fails,%ld",in_RDI->nconstrfails);
      fprintf(in_RSI,",Initial step size,%.16g",in_RDI->h0u);
      fprintf(in_RSI,",Last step size,%.16g",in_RDI->hold);
      fprintf(in_RSI,",Current step size,%.16g",in_RDI->next_h);
      if (in_RDI->root_mem != (ARKodeRootMem)0x0) {
        fprintf(in_RSI,",Roof fn evals,%ld",in_RDI->root_mem->nge);
      }
    }
    if ((in_RDI->relax_enabled == 0) ||
       (local_4 = arkRelaxPrintAllStats
                            (in_RSI,(FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                             (SUNOutputFormat)((ulong)in_RDI >> 0x20)), local_4 == 0)) {
      if (in_RDI->step_printallstats == (ARKTimestepPrintAllStats)0x0) {
        local_4 = 0;
      }
      else {
        local_4 = (*in_RDI->step_printallstats)(in_RDI,(FILE *)in_RSI,in_EDX);
      }
    }
  }
  return local_4;
}

Assistant:

int ARKodePrintAllStats(void* arkode_mem, FILE* outfile, SUNOutputFormat fmt)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;

  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  switch (fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    fprintf(outfile, "Current time                 = %" RSYM "\n", ark_mem->tcur);
    fprintf(outfile, "Steps                        = %ld\n", ark_mem->nst);
    fprintf(outfile, "Step attempts                = %ld\n",
            ark_mem->nst_attempts);
    fprintf(outfile, "Stability limited steps      = %ld\n",
            ark_mem->hadapt_mem->nst_exp);
    fprintf(outfile, "Accuracy limited steps       = %ld\n",
            ark_mem->hadapt_mem->nst_acc);
    fprintf(outfile, "Error test fails             = %ld\n", ark_mem->netf);
    fprintf(outfile, "NLS step fails               = %ld\n", ark_mem->ncfn);
    fprintf(outfile, "Inequality constraint fails  = %ld\n",
            ark_mem->nconstrfails);
    fprintf(outfile, "Initial step size            = %" RSYM "\n", ark_mem->h0u);
    fprintf(outfile, "Last step size               = %" RSYM "\n", ark_mem->hold);
    fprintf(outfile, "Current step size            = %" RSYM "\n",
            ark_mem->next_h);
    if (ark_mem->root_mem)
    {
      ark_root_mem = (ARKodeRootMem)ark_mem->root_mem;
      fprintf(outfile, "Root fn evals                = %ld\n", ark_root_mem->nge);
    }
    break;
  case SUN_OUTPUTFORMAT_CSV:
    fprintf(outfile, "Time,%" RSYM, ark_mem->tcur);
    fprintf(outfile, ",Steps,%ld", ark_mem->nst);
    fprintf(outfile, ",Step attempts,%ld", ark_mem->nst_attempts);
    fprintf(outfile, ",Stability limited steps,%ld",
            ark_mem->hadapt_mem->nst_exp);
    fprintf(outfile, ",Accuracy limited steps,%ld", ark_mem->hadapt_mem->nst_acc);
    fprintf(outfile, ",Error test fails,%ld", ark_mem->netf);
    fprintf(outfile, ",NLS step fails,%ld", ark_mem->ncfn);
    fprintf(outfile, ",Inequality constraint fails,%ld", ark_mem->nconstrfails);
    fprintf(outfile, ",Initial step size,%" RSYM, ark_mem->h0u);
    fprintf(outfile, ",Last step size,%" RSYM, ark_mem->hold);
    fprintf(outfile, ",Current step size,%" RSYM, ark_mem->next_h);
    if (ark_mem->root_mem)
    {
      ark_root_mem = (ARKodeRootMem)ark_mem->root_mem;
      fprintf(outfile, ",Roof fn evals,%ld", ark_root_mem->nge);
    }
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid formatting option.");
    return (ARK_ILL_INPUT);
  }

  /* Print relaxation stats */
  if (ark_mem->relax_enabled)
  {
    retval = arkRelaxPrintAllStats(ark_mem, outfile, fmt);
    if (retval != ARK_SUCCESS) { return (retval); }
  }

  /* Print stepper stats (if provided) */
  if (ark_mem->step_printallstats)
  {
    return (ark_mem->step_printallstats(ark_mem, outfile, fmt));
  }

  return (ARK_SUCCESS);
}